

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx *mtctx)

{
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  ldmEntry_t *__ptr;
  BYTE *pBVar3;
  
  if (mtctx != (ZSTDMT_CCtx *)0x0) {
    if ((mtctx->field_0xc08 & 1) == 0) {
      POOL_free(mtctx->factory);
    }
    ZSTDMT_releaseAllJobResources(mtctx);
    ZSTDMT_freeJobsTable(mtctx->jobs,mtctx->jobIDMask + 1,mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeBufferPool(mtctx->seqPool);
    p_Var1 = (mtctx->serial).params.customMem.customFree;
    pvVar2 = (mtctx->serial).params.customMem.opaque;
    pthread_mutex_destroy((pthread_mutex_t *)&mtctx->serial);
    pthread_cond_destroy((pthread_cond_t *)&(mtctx->serial).cond);
    pthread_mutex_destroy((pthread_mutex_t *)&(mtctx->serial).ldmWindowMutex);
    pthread_cond_destroy((pthread_cond_t *)&(mtctx->serial).ldmWindowCond);
    __ptr = (mtctx->serial).ldmState.hashTable;
    if (__ptr != (ldmEntry_t *)0x0) {
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(__ptr);
      }
      else {
        (*p_Var1)(pvVar2,__ptr);
      }
    }
    pBVar3 = (mtctx->serial).ldmState.bucketOffsets;
    if (pBVar3 != (BYTE *)0x0) {
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(pBVar3);
      }
      else {
        (*p_Var1)(pvVar2,pBVar3);
      }
    }
    ZSTD_freeCDict(mtctx->cdictLocal);
    pBVar3 = (mtctx->roundBuff).buffer;
    if (pBVar3 != (BYTE *)0x0) {
      p_Var1 = (mtctx->cMem).customFree;
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(pBVar3);
      }
      else {
        (*p_Var1)((mtctx->cMem).opaque,pBVar3);
      }
    }
    p_Var1 = (mtctx->cMem).customFree;
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(mtctx);
    }
    else {
      (*p_Var1)((mtctx->cMem).opaque,mtctx);
    }
  }
  return 0;
}

Assistant:

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx==NULL) return 0;   /* compatible with free on NULL */
    if (!mtctx->providedFactory)
        POOL_free(mtctx->factory);   /* stop and free worker threads */
    ZSTDMT_releaseAllJobResources(mtctx);  /* release job resources into pools first */
    ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeSeqPool(mtctx->seqPool);
    ZSTDMT_serialState_free(&mtctx->serial);
    ZSTD_freeCDict(mtctx->cdictLocal);
    if (mtctx->roundBuff.buffer)
        ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
    ZSTD_customFree(mtctx, mtctx->cMem);
    return 0;
}